

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O2

void __thiscall
InstructionGenerator::genCreateString(InstructionGenerator *this,string *identifier,string *val)

{
  size_type sVar1;
  char *c;
  pointer __args;
  undefined1 local_50 [48];
  
  local_50._0_4_ = 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,(Instruction *)local_50);
  local_50._0_8_ = val->_M_string_length;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
            (this->bytecode,(unsigned_long *)local_50);
  __args = (val->_M_dataplus)._M_p;
  for (sVar1 = val->_M_string_length; sVar1 != 0; sVar1 = sVar1 - 1) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<char_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode,__args);
    __args = __args + 1;
  }
  Variable::Variable((Variable *)local_50,identifier,STRING);
  VirtualStack::push(&this->super_VirtualStack,(Variable *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  return;
}

Assistant:

void InstructionGenerator::genCreateString(const std::string &identifier, const std::string &val)
{
    bytecode->emplace_back(Instruction::CREATE_STRING);
    bytecode->emplace_back(val.size());
    for(const auto &c : val)
        bytecode->emplace_back(c);
    push(Variable(identifier, DataType::STRING));
}